

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall particleSamples::decide_to_pick_charge(particleSamples *this,int monval)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
  uVar2 = 0xffffffff;
  if (-1 < iVar1) {
    uVar2 = (uint)(iVar1 != 0);
  }
  return uVar2;
}

Assistant:

int particleSamples::decide_to_pick_charge(int monval) {
    int pick_flag = 0;
    int charge = decayer_ptr->get_particle_charge(monval);
    if (charge < 0)
        pick_flag = -1;
    else if (charge > 0)
        pick_flag = 1;
    return (pick_flag);
}